

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandSendAig(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Aig_Man_t *p;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Man_t *pGia;
  Aig_Man_t *pAig;
  int fAbsNetlist;
  int fAndSpace;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = true;
  bVar2 = false;
  Extra_UtilGetoptReset();
  while (iVar3 = Extra_UtilGetopt(argc,argv,"ah"), iVar3 != -1) {
    if (iVar3 == 0x61) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    else {
      if (iVar3 != 0x62) {
        Abc_Print(-2,"usage: send_aig -a\n");
        Abc_Print(-2,"\t         sends current AIG to the bridge\n");
        pcVar4 = "no";
        if (bVar1) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-a     : toggle sending AIG from &-space [default = %s]\n",pcVar4);
        pcVar4 = "no";
        if (bVar2) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-b     : toggle sending netlist tagged as \"abstraction\". [default = %s]\n"
                  ,pcVar4);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      bVar2 = (bool)(bVar2 ^ 1);
    }
  }
  iVar3 = Abc_FrameIsBridgeMode();
  if (iVar3 == 0) {
    Abc_Print(-1,"The bridge mode is not available.\n");
    return 1;
  }
  if (bVar1) {
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"There is no AIG in the &-space.\n");
      return 1;
    }
    iVar3 = 0x6a;
    if (bVar2) {
      iVar3 = 0x6b;
    }
    Gia_ManToBridgeAbsNetlist(_stdout,pAbc->pGia,iVar3);
  }
  else {
    if (pAbc->pNtkCur == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"There is no network in the main-space.\n");
      return 1;
    }
    iVar3 = Abc_NtkIsStrash(pAbc->pNtkCur);
    if (iVar3 == 0) {
      Abc_Print(-1,"The main-space network is not an AIG.\n");
      return 1;
    }
    p = Abc_NtkToDar(pAbc->pNtkCur,0,1);
    p_00 = Gia_ManFromAig(p);
    Aig_ManStop(p);
    iVar3 = 0x6a;
    if (bVar2) {
      iVar3 = 0x6b;
    }
    Gia_ManToBridgeAbsNetlist(_stdout,p_00,iVar3);
    Gia_ManStop(p_00);
  }
  return 0;
}

Assistant:

int Abc_CommandSendAig( Abc_Frame_t * pAbc, int argc, char ** argv )
{
//    const int BRIDGE_NETLIST = 106;
//    const int BRIDGE_ABS_NETLIST = 107;

    int c, fAndSpace = 1, fAbsNetlist = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ah" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fAndSpace ^= 1;
            break;
        case 'b':
            fAbsNetlist ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( !Abc_FrameIsBridgeMode() )
    {
        Abc_Print( -1, "The bridge mode is not available.\n" );
        return 1;
    }
    if ( fAndSpace )
    {
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( -1, "There is no AIG in the &-space.\n" );
            return 1;
        }
        Gia_ManToBridgeAbsNetlist( stdout, pAbc->pGia, fAbsNetlist ? BRIDGE_ABS_NETLIST : BRIDGE_NETLIST );
    }
    else
    {
        Aig_Man_t * pAig;
        Gia_Man_t * pGia;
        if ( pAbc->pNtkCur == NULL )
        {
            Abc_Print( -1, "There is no network in the main-space.\n" );
            return 1;
        }
        if ( !Abc_NtkIsStrash(pAbc->pNtkCur) )
        {
            Abc_Print( -1, "The main-space network is not an AIG.\n" );
            return 1;
        }
        pAig = Abc_NtkToDar( pAbc->pNtkCur, 0, 1 );
        pGia = Gia_ManFromAig( pAig );
        Aig_ManStop( pAig );
        Gia_ManToBridgeAbsNetlist( stdout, pGia, fAbsNetlist ? BRIDGE_ABS_NETLIST : BRIDGE_NETLIST  );
        Gia_ManStop( pGia );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: send_aig -a\n" );
    Abc_Print( -2, "\t         sends current AIG to the bridge\n" );
    Abc_Print( -2, "\t-a     : toggle sending AIG from &-space [default = %s]\n", fAndSpace? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle sending netlist tagged as \"abstraction\". [default = %s]\n", fAbsNetlist? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}